

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

void append_entry(char **p,char *prefix,wchar_t tag,char *name,wchar_t perm,wchar_t id)

{
  char *pcVar1;
  char cVar2;
  size_t sVar3;
  wchar_t local_30;
  wchar_t id_local;
  wchar_t perm_local;
  char *name_local;
  wchar_t tag_local;
  char *prefix_local;
  char **p_local;
  
  if (prefix != (char *)0x0) {
    strcpy(*p,prefix);
    sVar3 = strlen(*p);
    *p = *p + sVar3;
  }
  local_30 = id;
  _id_local = name;
  switch(tag) {
  case L'✒':
    _id_local = (char *)0x0;
    local_30 = L'\xffffffff';
  case L'✑':
    strcpy(*p,"user");
    break;
  case L'✔':
    _id_local = (char *)0x0;
    local_30 = L'\xffffffff';
  case L'✓':
    strcpy(*p,"group");
    break;
  case L'✕':
    strcpy(*p,"mask");
    _id_local = (char *)0x0;
    local_30 = L'\xffffffff';
    break;
  case L'✖':
    strcpy(*p,"other");
    _id_local = (char *)0x0;
    local_30 = L'\xffffffff';
  }
  sVar3 = strlen(*p);
  *p = *p + sVar3;
  pcVar1 = *p;
  *p = pcVar1 + 1;
  *pcVar1 = ':';
  if (_id_local == (char *)0x0) {
    if ((tag == L'✑') || (tag == L'✓')) {
      append_id(p,local_30);
      local_30 = L'\xffffffff';
    }
  }
  else {
    strcpy(*p,_id_local);
    sVar3 = strlen(*p);
    *p = *p + sVar3;
  }
  pcVar1 = *p;
  *p = pcVar1 + 1;
  *pcVar1 = ':';
  cVar2 = '-';
  if ((perm & 0x124U) != 0) {
    cVar2 = 'r';
  }
  pcVar1 = *p;
  *p = pcVar1 + 1;
  *pcVar1 = cVar2;
  cVar2 = '-';
  if ((perm & 0x92U) != 0) {
    cVar2 = 'w';
  }
  pcVar1 = *p;
  *p = pcVar1 + 1;
  *pcVar1 = cVar2;
  cVar2 = '-';
  if ((perm & 0x49U) != 0) {
    cVar2 = 'x';
  }
  pcVar1 = *p;
  *p = pcVar1 + 1;
  *pcVar1 = cVar2;
  if (local_30 != L'\xffffffff') {
    pcVar1 = *p;
    *p = pcVar1 + 1;
    *pcVar1 = ':';
    append_id(p,local_30);
  }
  **p = '\0';
  return;
}

Assistant:

static void
append_entry(char **p, const char *prefix, int tag,
    const char *name, int perm, int id)
{
	if (prefix != NULL) {
		strcpy(*p, prefix);
		*p += strlen(*p);
	}
	switch (tag) {
	case ARCHIVE_ENTRY_ACL_USER_OBJ:
		name = NULL;
		id = -1;
		/* FALLTHROUGH */
	case ARCHIVE_ENTRY_ACL_USER:
		strcpy(*p, "user");
		break;
	case ARCHIVE_ENTRY_ACL_GROUP_OBJ:
		name = NULL;
		id = -1;
		/* FALLTHROUGH */
	case ARCHIVE_ENTRY_ACL_GROUP:
		strcpy(*p, "group");
		break;
	case ARCHIVE_ENTRY_ACL_MASK:
		strcpy(*p, "mask");
		name = NULL;
		id = -1;
		break;
	case ARCHIVE_ENTRY_ACL_OTHER:
		strcpy(*p, "other");
		name = NULL;
		id = -1;
		break;
	}
	*p += strlen(*p);
	*(*p)++ = ':';
	if (name != NULL) {
		strcpy(*p, name);
		*p += strlen(*p);
	} else if (tag == ARCHIVE_ENTRY_ACL_USER
	    || tag == ARCHIVE_ENTRY_ACL_GROUP) {
		append_id(p, id);
		id = -1;
	}
	*(*p)++ = ':';
	*(*p)++ = (perm & 0444) ? 'r' : '-';
	*(*p)++ = (perm & 0222) ? 'w' : '-';
	*(*p)++ = (perm & 0111) ? 'x' : '-';
	if (id != -1) {
		*(*p)++ = ':';
		append_id(p, id);
	}
	**p = '\0';
}